

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

void ecs_run_add_actions(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t row,
                        int32_t count,ecs_entities_t *added,_Bool get_all,_Bool run_on_set)

{
  uint uVar1;
  int iVar2;
  ecs_column_t *peVar3;
  ecs_type_t type;
  ecs_vector_t *trigger_vec;
  _Bool _Var4;
  uint uVar5;
  ulong uVar6;
  ecs_table_t *node;
  long lVar7;
  ulong uVar8;
  ecs_entity_t component;
  int32_t local_374;
  ecs_table_t *local_370;
  ecs_entities_t to_remove;
  ecs_column_info_t cinfo [32];
  
  _ecs_assert(added != (ecs_entities_t *)0x0,0xc,(char *)0x0,"added != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x374);
  if (added == (ecs_entities_t *)0x0) {
    __assert_fail("added != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x374,
                  "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
                 );
  }
  _ecs_assert(added->count < 0x20,2,(char *)0x0,"added->count < ECS_MAX_ADD_REMOVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x375);
  if (0x1f < added->count) {
    __assert_fail("added->count < (32)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x375,
                  "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
                 );
  }
  ecs_get_column_info(world,table,added,cinfo,get_all);
  uVar1 = added->count;
  if ((table->flags & 4) != 0) {
    _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x2c2);
    if (data == (ecs_data_t *)0x0) {
      __assert_fail("data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2c2,
                    "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                   );
    }
    lVar7 = 0;
    _ecs_assert(uVar1 != 0,0xc,(char *)0x0,"component_count != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x2c3);
    if (uVar1 == 0) {
      __assert_fail("component_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2c3,
                    "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                   );
    }
    peVar3 = data->columns;
    type = table->type;
    local_374 = table->column_count;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    node = table;
    local_370 = table;
    for (; table = local_370, uVar6 * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
      uVar8 = *(ulong *)((long)&cinfo[0].id + lVar7);
      component = uVar8;
      if ((char)(uVar8 >> 0x38) == -2) {
        _ecs_assert((uVar8 & 0xffffffffffffff) != 0,2,(char *)0x0,"base != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2d3);
        if ((uVar8 & 0xffffffffffffff) == 0) {
          __assert_fail("base != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x2d3,
                        "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                       );
        }
        instantiate(world,uVar8 & 0xffffffffffffff,local_370,data,row,count);
        to_remove.array = &component;
        to_remove.count = 1;
        node = ecs_table_traverse_remove(world,node,&to_remove,(ecs_entities_t *)0x0);
      }
      iVar2 = *(int *)((long)&cinfo[0].column + lVar7);
      if (((long)iVar2 != -1) && (iVar2 < local_374)) {
        _Var4 = override_component(world,component,type,data,peVar3 + iVar2,row,count);
        if (_Var4) {
          to_remove.array = &component;
          to_remove.count = 1;
          node = ecs_table_traverse_remove(world,node,&to_remove,(ecs_entities_t *)0x0);
        }
      }
    }
    if ((run_on_set) && (node != local_370)) {
      ecs_run_monitors(world,local_370,local_370->on_set_all,row,count,node->on_set_all);
    }
  }
  uVar5 = table->flags;
  if ((uVar5 >> 0x10 & 1) != 0) {
    set_switch(world,table,data,row,count,added,false);
    uVar5 = table->flags;
  }
  if ((uVar5 >> 0xb & 1) != 0) {
    uVar6 = 0;
    _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x340);
    if (data == (ecs_data_t *)0x0) {
      __assert_fail("data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x340,
                    "void ecs_components_on_add(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t)"
                   );
    }
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar6;
    }
    for (; uVar8 * 0x18 - uVar6 != 0; uVar6 = uVar6 + 0x18) {
      lVar7 = *(long *)((long)&cinfo[0].ci + uVar6);
      if ((lVar7 != 0) &&
         (trigger_vec = *(ecs_vector_t **)(lVar7 + 8), trigger_vec != (ecs_vector_t *)0x0)) {
        ecs_run_component_trigger
                  (world,trigger_vec,*(ecs_entity_t *)((long)&cinfo[0].id + uVar6),table,data,row,
                   count);
      }
    }
  }
  return;
}

Assistant:

void ecs_run_add_actions(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_entities_t * added,
    bool get_all,
    bool run_on_set)
{
    ecs_assert(added != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(added->count < ECS_MAX_ADD_REMOVE, ECS_INVALID_PARAMETER, NULL);

    ecs_column_info_t cinfo[ECS_MAX_ADD_REMOVE];
    ecs_get_column_info(world, table, added, cinfo, get_all);
    int added_count = added->count;

    if (table->flags & EcsTableHasBase) {
        ecs_components_override(
            world, table, data, row, count, cinfo, 
            added_count, run_on_set);
    }

    if (table->flags & EcsTableHasSwitch) {
        ecs_components_switch(world, table, data, row, count, added, NULL);
    }

    if (table->flags & EcsTableHasOnAdd) {
        ecs_components_on_add(world, table, data, row, count, 
            cinfo, added_count);
    }
}